

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::flush
          (xml_buffered_writer *this,char_t *data,size_t size)

{
  anon_union_8192_4_fbc60714_for_scratch *result;
  ushort *puVar1;
  byte bVar2;
  xml_encoding xVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  anon_union_8192_4_fbc60714_for_scratch *paVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  uint32_t *dest;
  
  if (size == 0) {
    return;
  }
  xVar3 = this->encoding;
  if (xVar3 == encoding_utf8) {
    UNRECOVERED_JUMPTABLE = this->writer->_vptr_xml_writer[2];
    (*UNRECOVERED_JUMPTABLE)(this->writer,data,size,UNRECOVERED_JUMPTABLE);
    return;
  }
  result = &this->scratch;
  if ((xVar3 & ~encoding_utf8) == encoding_utf16_le) {
    lVar7 = 0x800;
    do {
      bVar2 = (byte)*(uint *)data;
      uVar5 = (uint)bVar2;
      if ((char)bVar2 < '\0') {
        if (((size == 1) || ((uVar5 & 0xffffffe0) != 0xc0)) ||
           ((*(byte *)((long)data + 1) & 0xc0) != 0x80)) {
          if (((size < 3) || ((uVar5 & 0xfffffff0) != 0xe0)) ||
             (((*(byte *)((long)data + 1) & 0xffc0) != 0x80 ||
              ((*(byte *)((long)data + 2) & 0xc0) != 0x80)))) {
            if (((size < 4) || ((uVar5 & 0xfffffff8) != 0xf0)) ||
               (((*(byte *)((long)data + 1) & 0xffffffc0) != 0x80 ||
                (((*(byte *)((long)data + 2) & 0xc0) != 0x80 ||
                 (bVar2 = *(byte *)((long)data + 3), (bVar2 & 0xc0) != 0x80)))))) {
              data = (char_t *)((long)data + 1);
              size = size - 1;
            }
            else {
              uVar10 = (uint)*(byte *)((long)data + 2) << 6;
              *(short *)(this->buffer + lVar7) =
                   (short)((uVar10 & 0xc00) +
                           ((*(byte *)((long)data + 1) & 0x3f) << 0xc | (uVar5 & 7) << 0x12) +
                           0x3ff0000 >> 10) + -0x2800;
              *(ushort *)(this->buffer + lVar7 + 2) = bVar2 & 0x3f | (ushort)uVar10 & 0x3ff | 0xdc00
              ;
              lVar7 = lVar7 + 4;
              data = (char_t *)((long)data + 4);
              size = size - 4;
            }
          }
          else {
            *(ushort *)(this->buffer + lVar7) =
                 *(byte *)((long)data + 2) & 0x3f |
                 (*(byte *)((long)data + 1) & 0x3f) << 6 | (ushort)bVar2 << 0xc;
            lVar7 = lVar7 + 2;
            data = (char_t *)((long)data + 3);
            size = size - 3;
          }
        }
        else {
          *(ushort *)(this->buffer + lVar7) =
               *(byte *)((long)data + 1) & 0x3f | (ushort)((uVar5 & 0x1f) << 6);
          lVar7 = lVar7 + 2;
          data = (char_t *)((long)data + 2);
          size = size - 2;
        }
      }
      else {
        *(ushort *)(this->buffer + lVar7) = (ushort)bVar2;
        lVar7 = lVar7 + 2;
        data = (char_t *)((long)data + 1);
        size = size - 1;
        if ((3 < size) && (((ulong)data & 3) == 0)) {
          do {
            if ((*(uint *)data & 0x80808080) != 0) break;
            *(ushort *)(this->buffer + lVar7) = (ushort)(byte)*(uint *)data;
            *(ushort *)(this->buffer + lVar7 + 2) = (ushort)*(byte *)((long)data + 1);
            *(ushort *)(this->buffer + lVar7 + 4) = (ushort)*(byte *)((long)data + 2);
            *(ushort *)(this->buffer + lVar7 + 6) = (ushort)*(byte *)((long)data + 3);
            lVar7 = lVar7 + 8;
            data = (char_t *)((long)data + 4);
            size = size - 4;
          } while (3 < size);
        }
      }
    } while (size != 0);
    if ((xVar3 != encoding_utf16_le) && (lVar7 != 0x800)) {
      lVar6 = 0;
      do {
        puVar1 = result->data_u16 + lVar6;
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        lVar6 = lVar6 + 1;
      } while (lVar7 + -0x800 >> 1 != lVar6);
    }
    uVar8 = lVar7 - 0x800;
  }
  else {
    if (xVar3 - encoding_utf32_le < 2) {
      paVar4 = (anon_union_8192_4_fbc60714_for_scratch *)
               utf_decoder<pugi::impl::(anonymous_namespace)::utf32_writer,_pugi::impl::(anonymous_namespace)::opt_false>
               ::decode_utf8_block((uint8_t *)data,size,(value_type)result->data_u8);
      if ((xVar3 != encoding_utf32_le) && ((long)paVar4 - (long)result != 0)) {
        lVar7 = 0;
        do {
          uVar5 = result->data_u32[lVar7];
          result->data_u32[lVar7] =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          lVar7 = lVar7 + 1;
        } while ((long)paVar4 - (long)result >> 2 != lVar7);
      }
    }
    else {
      paVar4 = result;
      if (xVar3 != encoding_latin1) {
        __assert_fail("!\"Invalid encoding\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                      ,0xaf8,
                      "size_t pugi::impl::(anonymous namespace)::convert_buffer(char_t *, uint8_t *, uint16_t *, uint32_t *, const char_t *, size_t, xml_encoding)"
                     );
      }
      do {
        bVar2 = (byte)*(uint *)data;
        if ((char)bVar2 < '\0') {
          if ((((size < 3) || ((bVar2 & 0xf0) != 0xe0)) ||
              ((*(byte *)((long)data + 1) & 0xc0) != 0x80)) ||
             ((*(byte *)((long)data + 2) & 0xc0) != 0x80)) {
            data = (char_t *)((long)data + 1);
            size = size - 1;
          }
          else {
            uVar5 = (uint)*(byte *)((long)data + 1) << 6;
            bVar9 = *(byte *)((long)data + 2) & 0x3f | (byte)uVar5;
            if ((uVar5 & 0xf00) != 0 || (bVar2 & 0xf) != 0) {
              bVar9 = 0x3f;
            }
            paVar4->data_u8[0] = bVar9;
            paVar4 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar4 + 1);
            data = (char_t *)((long)data + 3);
            size = size - 3;
          }
        }
        else {
          paVar4->data_u8[0] = bVar2;
          paVar4 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar4->data_u8 + 1);
          data = (char_t *)((long)data + 1);
          size = size - 1;
          if ((3 < size) && (((ulong)data & 3) == 0)) {
            do {
              if ((*(uint *)data & 0x80808080) != 0) break;
              paVar4->data_u8[0] = (byte)*(uint *)data;
              paVar4->data_u8[1] = *(byte *)((long)data + 1);
              paVar4->data_u8[2] = *(byte *)((long)data + 2);
              paVar4->data_u8[3] = *(byte *)((long)data + 3);
              paVar4 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar4->data_u8 + 4);
              data = (char_t *)((long)data + 4);
              size = size - 4;
            } while (3 < size);
          }
        }
      } while (size != 0);
    }
    uVar8 = (long)paVar4 - (long)result->data_u8;
  }
  if (uVar8 < 0x2001) {
    (*this->writer->_vptr_xml_writer[2])(this->writer,result);
    return;
  }
  __assert_fail("result <= sizeof(scratch)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                ,0xb1e,
                "void pugi::impl::(anonymous namespace)::xml_buffered_writer::flush(const char_t *, size_t)"
               );
}

Assistant:

void flush(const char_t* data, size_t size)
		{
			if (size == 0) return;

			// fast path, just write data
			if (encoding == get_write_native_encoding())
				writer.write(data, size * sizeof(char_t));
			else
			{
				// convert chunk
				size_t result = convert_buffer(scratch.data_char, scratch.data_u8, scratch.data_u16, scratch.data_u32, data, size, encoding);
				assert(result <= sizeof(scratch));

				// write data
				writer.write(scratch.data_u8, result);
			}
		}